

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

bool __thiscall
GdlBinaryExpression::GenerateSetBitsOp
          (GdlBinaryExpression *this,uint32_t fxdRuleVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,int iritCurrent,
          vector<int,_std::allocator<int>_> *pviritInput,int nIIndex,bool fAttachAt,int iritAttachTo
          )

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  GdlExpression *pGVar4;
  GrcSymbolTableEntry *this_00;
  uint in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  byte in_stack_00000008;
  undefined4 in_stack_00000010;
  int nValue;
  int nMask;
  string staOp12;
  GdlUnaryExpression *pexp1And2Not;
  string staOp1;
  GdlNumericExpression *pexp2Value;
  GdlBinaryExpression *pexp1And;
  string staOp;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  GrcSymbolTableEntry *in_stack_fffffffffffffed8;
  long *local_110;
  GdlBinaryExpression *local_100;
  undefined1 local_d0 [4];
  int local_cc;
  string local_c8 [32];
  GrcSymbolTableEntry *local_a8;
  string local_a0 [32];
  long *local_80;
  GdlBinaryExpression *local_78;
  string local_60 [35];
  byte local_3d;
  uint local_3c;
  undefined8 local_38;
  uint local_2c;
  undefined8 local_28;
  uint local_1c;
  byte local_9;
  
  local_3d = in_stack_00000008 & 1;
  local_3c = in_R9D;
  local_38 = in_R8;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_1c = in_ESI;
  GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffed8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (bVar1) {
    if (*(long *)(in_RDI + 0x40) == 0) {
      local_100 = (GdlBinaryExpression *)0x0;
    }
    else {
      local_100 = (GdlBinaryExpression *)
                  __dynamic_cast(*(long *)(in_RDI + 0x40),&GdlExpression::typeinfo,&typeinfo,0);
    }
    local_78 = local_100;
    if (*(long *)(in_RDI + 0x48) == 0) {
      local_110 = (long *)0x0;
    }
    else {
      local_110 = (long *)__dynamic_cast(*(long *)(in_RDI + 0x48),&GdlExpression::typeinfo,
                                         &GdlNumericExpression::typeinfo,0);
    }
    local_80 = local_110;
    if ((local_78 != (GdlBinaryExpression *)0x0) && (local_110 != (long *)0x0)) {
      Operator(local_78);
      GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffed8);
      pGVar4 = Operand2(local_78);
      if (pGVar4 == (GdlExpression *)0x0) {
        this_00 = (GrcSymbolTableEntry *)0x0;
      }
      else {
        this_00 = (GrcSymbolTableEntry *)
                  __dynamic_cast(pGVar4,&GdlExpression::typeinfo,&GdlUnaryExpression::typeinfo,0);
      }
      local_a8 = this_00;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
      ;
      if ((bVar1) && (local_a8 != (GrcSymbolTableEntry *)0x0)) {
        GdlUnaryExpression::Operator((GdlUnaryExpression *)local_a8);
        GrcSymbolTableEntry::FullName_abi_cxx11_(this_00);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                ));
        if (bVar1) {
          pGVar4 = GdlUnaryExpression::Operand((GdlUnaryExpression *)local_a8);
          uVar3 = (*pGVar4->_vptr_GdlExpression[7])(pGVar4,&local_cc,0);
          if ((((uVar3 & 1) == 0) ||
              (bVar2 = (**(code **)(*local_80 + 0x38))(local_80,local_d0,0), (bVar2 & 1) == 0)) ||
             (0xffff < local_cc)) goto LAB_0019159c;
          pGVar4 = Operand1(local_78);
          uVar3 = local_3d & 1;
          (*pGVar4->_vptr_GdlExpression[0x1c])
                    (pGVar4,(ulong)local_1c,local_28,(ulong)local_2c,local_38,(ulong)local_3c,uVar3,
                     in_stack_00000010,0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_00000010),
                     (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffe8c,uVar3));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_00000010),
                     (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffe8c,uVar3));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_00000010),
                     (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffe8c,uVar3));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_00000010),
                     (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffe8c,uVar3));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_00000010),
                     (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffe8c,uVar3));
          local_9 = 1;
          bVar1 = true;
        }
        else {
LAB_0019159c:
          bVar1 = false;
        }
        std::__cxx11::string::~string(local_c8);
        if (!bVar1) goto LAB_001915c3;
      }
      else {
LAB_001915c3:
        bVar1 = false;
      }
      std::__cxx11::string::~string(local_a0);
      if (bVar1) goto LAB_0019160e;
    }
  }
  local_9 = 0;
LAB_0019160e:
  std::__cxx11::string::~string(local_60);
  return (bool)(local_9 & 1);
}

Assistant:

bool GdlBinaryExpression::GenerateSetBitsOp(uint32_t fxdRuleVersion, std::vector<gr::byte> & vbOutput,
	int iritCurrent, std::vector<int> * pviritInput, int nIIndex,
	bool fAttachAt, int iritAttachTo)
{
	std::string staOp = m_psymOperator->FullName();
	if (staOp == "|")
	{
		GdlBinaryExpression * pexp1And = dynamic_cast<GdlBinaryExpression *>(m_pexpOperand1);
		GdlNumericExpression * pexp2Value = dynamic_cast<GdlNumericExpression *>(m_pexpOperand2);
		if (pexp1And && pexp2Value)
		{
			std::string staOp1 = pexp1And->Operator()->FullName();
			GdlUnaryExpression * pexp1And2Not = dynamic_cast<GdlUnaryExpression *>(pexp1And->Operand2());
			if (staOp1 == "&" && pexp1And2Not)
			{
				std::string staOp12 = pexp1And2Not->Operator()->FullName();
				if (staOp12 == "~")
				{
					int nMask, nValue;
					if (pexp1And2Not->Operand()->ResolveToInteger(&nMask, false)
						&& pexp2Value->ResolveToInteger(&nValue, false)
						&& nMask <= 0xFFFF)
					{
						// Okay, it's the right form.
						pexp1And->Operand1()->GenerateEngineCode(fxdRuleVersion, vbOutput, iritCurrent,
							pviritInput, nIIndex, fAttachAt, iritAttachTo, NULL);
						vbOutput.push_back(kopSetBits);
						vbOutput.push_back(nMask >> 8);
						vbOutput.push_back(nMask & 0x000000FF);
						vbOutput.push_back(nValue >> 8);
						vbOutput.push_back(nValue & 0x000000FF);
						return true;
					}
				}
			}
		}
	}
	
	return false;
}